

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iexchange.cpp
# Opt level: O3

bool bounce(Block *b,ProxyWithLink *cp)

{
  undefined4 uVar1;
  Link *pLVar2;
  undefined4 uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  mapped_type *pmVar8;
  pointer pBVar9;
  mapped_type *pmVar10;
  uint uVar11;
  IncomingQueues *this;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  Particle p;
  undefined8 local_b0;
  ulong local_a8;
  ProxyWithLink *local_a0;
  OutgoingQueues *local_98;
  Link *local_90;
  ulong local_88 [2];
  ulong local_78;
  ulong local_68;
  ulong local_58;
  long local_40;
  Block *local_38;
  
  pLVar2 = cp->link_;
  local_a8 = (ulong)(uint)(cp->super_Proxy).gid_;
  local_a0 = cp;
  if (0 < (long)b->count) {
    format_str.size_ = 0x1a;
    format_str.data_ = "[{}] enqueue {} particles\n";
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         local_88;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = 0x11;
    local_88[0] = local_a8;
    local_78 = (long)b->count;
    fmt::v7::vprint(_stderr,format_str,args);
    if (0 < b->count) {
      local_98 = &(local_a0->super_Proxy).outgoing_;
      uVar11 = (int)local_a8 * 1000;
      do {
        iVar5 = rand();
        iVar5 = iVar5 % (int)((ulong)((long)(pLVar2->neighbors_).
                                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(pLVar2->neighbors_).
                                           super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar6 = rand();
        uVar7 = iVar6 % 0x14 + 1;
        local_68 = (ulong)uVar7;
        local_b0 = CONCAT44(uVar7,uVar11);
        local_78 = (ulong)uVar11;
        local_58 = (ulong)(uint)(pLVar2->neighbors_).
                                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar5].gid;
        local_88[0] = local_a8;
        format_str_00.size_ = 0x18;
        format_str_00.data_ = "[{}] -> ({},{}) -> [{}]\n";
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             local_88;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = 0x1111;
        fmt::v7::vprint(_stderr,format_str_00,args_00);
        pmVar8 = std::
                 map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                 ::operator[](local_98,(pLVar2->neighbors_).
                                       super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                       ._M_impl.super__Vector_impl_data._M_start + iVar5);
        (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar8,&local_b0,8);
        uVar1 = b->count;
        uVar3 = b->expected_particles;
        b->count = uVar1 + -1;
        b->expected_particles = uVar3 + 1;
        b->expected_hops = b->expected_hops + local_b0._4_4_;
        uVar11 = uVar11 + 1;
      } while (1 < (int)uVar1);
    }
  }
  pBVar9 = (pLVar2->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pLVar2->neighbors_).
                              super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pBVar9) >> 3)) {
    this = &(local_a0->super_Proxy).incoming_;
    local_a0 = (ProxyWithLink *)&(local_a0->super_Proxy).outgoing_;
    local_40 = 0;
    local_98 = (OutgoingQueues *)this;
    local_90 = pLVar2;
    local_38 = b;
    do {
      uVar11 = pBVar9[local_40].gid;
      local_88[0] = CONCAT44(local_88[0]._4_4_,uVar11);
      pmVar10 = std::
                map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                ::operator[](this,(key_type *)local_88);
      if (pmVar10->position <
          (ulong)((long)(pmVar10->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pmVar10->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
        do {
          local_b0 = 0xffffffff;
          local_88[0] = CONCAT44(local_88[0]._4_4_,uVar11);
          pmVar10 = std::
                    map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                    ::operator[](this,(key_type *)local_88);
          (*(pmVar10->super_BinaryBuffer)._vptr_BinaryBuffer[4])(pmVar10,&local_b0,8);
          local_78 = local_b0 & 0xffffffff;
          local_68 = local_b0 >> 0x20;
          local_88[0] = local_a8;
          format_str_01.size_ = 0x18;
          format_str_01.data_ = "[{}] <- ({},{}) <- [{}]\n";
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)local_88;
          args_01.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = 0x1111;
          local_58 = (ulong)uVar11;
          fmt::v7::vprint(_stderr,format_str_01,args_01);
          uVar4 = local_b0;
          iVar5 = local_b0._4_4_;
          uVar7 = local_b0._4_4_ - 1;
          local_b0 = CONCAT44(uVar7,(undefined4)local_b0);
          b->finished_hops = b->finished_hops + 1;
          if (iVar5 < 2) {
            local_78 = uVar4 & 0xffffffff;
            local_68 = (ulong)uVar7;
            local_88[0] = local_a8;
            format_str_03.size_ = 0x1d;
            format_str_03.data_ = "[{}] finish particle ({},{})\n";
            args_03.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)local_88;
            args_03.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = 0x111;
            fmt::v7::vprint(_stderr,format_str_03,args_03);
            b->finished_particles = b->finished_particles + 1;
          }
          else {
            iVar5 = rand();
            pLVar2 = local_90;
            pBVar9 = (local_90->neighbors_).
                     super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar5 = iVar5 % (int)((ulong)((long)(local_90->neighbors_).
                                                super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pBVar9) >> 3);
            local_78 = local_b0 & 0xffffffff;
            local_68 = local_b0 >> 0x20;
            local_58 = (ulong)(uint)pBVar9[iVar5].gid;
            local_88[0] = local_a8;
            format_str_02.size_ = 0x18;
            format_str_02.data_ = "[{}] -> ({},{}) -> [{}]\n";
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)local_88;
            args_02.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = 0x1111;
            fmt::v7::vprint(_stderr,format_str_02,args_02);
            this = (IncomingQueues *)local_98;
            pmVar8 = std::
                     map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                     ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                                   *)local_a0,
                                  (pLVar2->neighbors_).
                                  super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                  _M_impl.super__Vector_impl_data._M_start + iVar5);
            (*(pmVar8->super_BinaryBuffer)._vptr_BinaryBuffer[2])(pmVar8,&local_b0,8);
          }
          local_88[0] = CONCAT44(local_88[0]._4_4_,uVar11);
          pmVar10 = std::
                    map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                    ::operator[](this,(key_type *)local_88);
        } while (pmVar10->position <
                 (ulong)((long)(pmVar10->buffer).super__Vector_base<char,_std::allocator<char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pmVar10->buffer).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start));
      }
      local_40 = local_40 + 1;
      pBVar9 = (local_90->neighbors_).
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (local_40 <
             (int)((ulong)((long)(local_90->neighbors_).
                                 super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pBVar9) >> 3));
  }
  return true;
}

Assistant:

bool bounce(Block*                              b,
            const diy::Master::ProxyWithLink&  cp)
{
    diy::Link* l = cp.link();
    int my_gid   = cp.gid();

    // start with every block enqueueing particles to random neighbors
    int id = my_gid * 1000;
    if (b->count > 0)
        fmt::print(stderr, "[{}] enqueue {} particles\n", my_gid, b->count);
    while (b->count > 0)
    {
        int nbr = rand() % l->size();
        Particle p(id++, 1 + rand() % 20);
        fmt::print(stderr, "[{}] -> ({},{}) -> [{}]\n", my_gid, p.id, p.hops, l->target(nbr).gid);
        cp.enqueue(l->target(nbr), p);
        b->count--;

        b->expected_particles++;
        b->expected_hops += p.hops;
    }

    // then dequeue as long as something is incoming and enqueue as long as the hop count is not exceeded
    // bounce will be called by master multiple times until no more messages are in flight anywhere
    for (int i = 0; i < l->size(); ++i)
    {
        int nbr_gid = l->target(i).gid;
        while (cp.incoming(nbr_gid))
        {
            Particle p;
            cp.dequeue(nbr_gid, p);
            fmt::print(stderr, "[{}] <- ({},{}) <- [{}]\n", my_gid, p.id, p.hops, nbr_gid);

            p.hops--;
            b->finished_hops++;
            if (p.hops > 0)
            {
                int nbr = rand() % l->size();
                fmt::print(stderr, "[{}] -> ({},{}) -> [{}]\n", my_gid, p.id, p.hops, l->target(nbr).gid);
                cp.enqueue(l->target(nbr), p);
            } else
            {
                fmt::print(stderr, "[{}] finish particle ({},{})\n", my_gid, p.id, p.hops);
                b->finished_particles++;
            }
        }
    }

    return true;
}